

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O1

void __thiscall wasm::WasmBinaryWriter::writeExports(WasmBinaryWriter *this)

{
  ExternalKind EVar1;
  pointer puVar2;
  Export *pEVar3;
  int32_t start;
  variant<wasm::Name,_wasm::HeapType> *pvVar4;
  size_t __n;
  void *__buf;
  void *__buf_00;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *__buf_01;
  int __fd;
  pointer puVar5;
  LEB<unsigned_int,_unsigned_char> local_34;
  
  if ((this->wasm->exports).
      super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->wasm->exports).
      super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    start = startSection<wasm::BinaryConsts::Section>(this,Export);
    __n = (ulong)((long)(this->wasm->exports).
                        super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->wasm->exports).
                       super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 3;
    LEB<unsigned_int,_unsigned_char>::write(&local_34,(int)this->o,__buf,__n);
    puVar5 = (this->wasm->exports).
             super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar2 = (this->wasm->exports).
             super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar5 != puVar2) {
      do {
        writeInlineString(this,(((puVar5->_M_t).
                                 super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                 .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl)->name).
                               super_IString.str);
        LEB<unsigned_int,_unsigned_char>::write(&local_34,(int)this->o,__buf_00,__n);
        pEVar3 = (puVar5->_M_t).
                 super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                 super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
        EVar1 = pEVar3->kind;
        if (4 < (ulong)(uint)EVar1) {
          handle_unreachable("unexpected extern kind",
                             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                             ,0x275);
        }
        __n = (long)&switchD_00c72dbd::switchdataD_00e4d2ac +
              (long)(int)(&switchD_00c72dbd::switchdataD_00e4d2ac)[(uint)EVar1];
        switch(EVar1) {
        case Function:
          if (*(__index_type *)
               ((long)&(pEVar3->value).super__Variant_base<wasm::Name,_wasm::HeapType> + 0x10) ==
              '\0') {
            pvVar4 = &pEVar3->value;
          }
          else {
            pvVar4 = (variant<wasm::Name,_wasm::HeapType> *)0x0;
          }
          __fd = (int)this->o;
          getFunctionIndex(this,(IString)*(IString *)
                                          &(pvVar4->super__Variant_base<wasm::Name,_wasm::HeapType>)
                                           .super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
                                           super__Copy_assign_alias<wasm::Name,_wasm::HeapType>);
          __buf_01 = extraout_RDX_02;
          break;
        case Table:
          if (*(__index_type *)
               ((long)&(pEVar3->value).super__Variant_base<wasm::Name,_wasm::HeapType> + 0x10) ==
              '\0') {
            pvVar4 = &pEVar3->value;
          }
          else {
            pvVar4 = (variant<wasm::Name,_wasm::HeapType> *)0x0;
          }
          __fd = (int)this->o;
          getTableIndex(this,(IString)*(IString *)
                                       &(pvVar4->super__Variant_base<wasm::Name,_wasm::HeapType>).
                                        super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
                                        super__Copy_assign_alias<wasm::Name,_wasm::HeapType>);
          __buf_01 = extraout_RDX_03;
          break;
        case Memory:
          if (*(__index_type *)
               ((long)&(pEVar3->value).super__Variant_base<wasm::Name,_wasm::HeapType> + 0x10) ==
              '\0') {
            pvVar4 = &pEVar3->value;
          }
          else {
            pvVar4 = (variant<wasm::Name,_wasm::HeapType> *)0x0;
          }
          __fd = (int)this->o;
          getMemoryIndex(this,(IString)*(IString *)
                                        &(pvVar4->super__Variant_base<wasm::Name,_wasm::HeapType>).
                                         super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
                                         super__Copy_assign_alias<wasm::Name,_wasm::HeapType>);
          __buf_01 = extraout_RDX_00;
          break;
        case Global:
          if (*(__index_type *)
               ((long)&(pEVar3->value).super__Variant_base<wasm::Name,_wasm::HeapType> + 0x10) ==
              '\0') {
            pvVar4 = &pEVar3->value;
          }
          else {
            pvVar4 = (variant<wasm::Name,_wasm::HeapType> *)0x0;
          }
          __fd = (int)this->o;
          getGlobalIndex(this,(IString)*(IString *)
                                        &(pvVar4->super__Variant_base<wasm::Name,_wasm::HeapType>).
                                         super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
                                         super__Copy_assign_alias<wasm::Name,_wasm::HeapType>);
          __buf_01 = extraout_RDX_01;
          break;
        case Tag:
          if (*(__index_type *)
               ((long)&(pEVar3->value).super__Variant_base<wasm::Name,_wasm::HeapType> + 0x10) ==
              '\0') {
            pvVar4 = &pEVar3->value;
          }
          else {
            pvVar4 = (variant<wasm::Name,_wasm::HeapType> *)0x0;
          }
          __fd = (int)this->o;
          getTagIndex(this,(IString)*(IString *)
                                     &(pvVar4->super__Variant_base<wasm::Name,_wasm::HeapType>).
                                      super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
                                      super__Copy_assign_alias<wasm::Name,_wasm::HeapType>);
          __buf_01 = extraout_RDX;
        }
        LEB<unsigned_int,_unsigned_char>::write(&local_34,__fd,__buf_01,__n);
        puVar5 = puVar5 + 1;
      } while (puVar5 != puVar2);
    }
    finishSection(this,start);
  }
  return;
}

Assistant:

void WasmBinaryWriter::writeExports() {
  if (wasm->exports.size() == 0) {
    return;
  }
  auto start = startSection(BinaryConsts::Section::Export);
  o << U32LEB(wasm->exports.size());
  for (auto& curr : wasm->exports) {
    writeInlineString(curr->name.str);
    o << U32LEB(int32_t(curr->kind));
    switch (curr->kind) {
      case ExternalKind::Function:
        o << U32LEB(getFunctionIndex(*curr->getInternalName()));
        break;
      case ExternalKind::Table:
        o << U32LEB(getTableIndex(*curr->getInternalName()));
        break;
      case ExternalKind::Memory:
        o << U32LEB(getMemoryIndex(*curr->getInternalName()));
        break;
      case ExternalKind::Global:
        o << U32LEB(getGlobalIndex(*curr->getInternalName()));
        break;
      case ExternalKind::Tag:
        o << U32LEB(getTagIndex(*curr->getInternalName()));
        break;
      default:
        WASM_UNREACHABLE("unexpected extern kind");
    }
  }
  finishSection(start);
}